

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall V2Transport::ProcessReceivedGarbageBytes(V2Transport *this)

{
  long lVar1;
  pointer puVar2;
  byte *pbVar3;
  bool bVar4;
  ulong uVar5;
  Logger *this_00;
  byte *pbVar6;
  array<std::byte,_16UL> *paVar7;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pbVar3 - (long)puVar2;
  bVar4 = true;
  if (0xf < uVar5) {
    pbVar6 = puVar2 + (uVar5 - 0x10);
    paVar7 = &(this->m_cipher).m_recv_garbage_terminator;
    do {
      if (*pbVar6 != paVar7->_M_elems[0]) {
        if (uVar5 == 0x100f) {
          this_00 = LogInstance();
          bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
          if (bVar4) {
            logging_function._M_str = "ProcessReceivedGarbageBytes";
            logging_function._M_len = 0x1b;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file._M_len = 0x50;
            LogPrintf_<long>(logging_function,source_file,0x48c,NET,Debug,
                             "V2 transport error: missing garbage terminator, peer=%d\n",
                             &this->m_nodeid);
          }
          bVar4 = false;
        }
        goto LAB_001a378b;
      }
      pbVar6 = pbVar6 + 1;
      paVar7 = (array<std::byte,_16UL> *)(paVar7->_M_elems + 1);
    } while (pbVar6 != pbVar3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&this->m_recv_aad,&this->m_recv_buffer);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_recv_aad,
               (size_type)
               ((this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish +
               (-0x10 - (long)(this->m_recv_aad).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start)));
    puVar2 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    this->m_recv_state = VERSION;
  }
LAB_001a378b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool V2Transport::ProcessReceivedGarbageBytes() noexcept
{
    AssertLockHeld(m_recv_mutex);
    Assume(m_recv_state == RecvState::GARB_GARBTERM);
    Assume(m_recv_buffer.size() <= MAX_GARBAGE_LEN + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
    if (m_recv_buffer.size() >= BIP324Cipher::GARBAGE_TERMINATOR_LEN) {
        if (std::ranges::equal(MakeByteSpan(m_recv_buffer).last(BIP324Cipher::GARBAGE_TERMINATOR_LEN), m_cipher.GetReceiveGarbageTerminator())) {
            // Garbage terminator received. Store garbage to authenticate it as AAD later.
            m_recv_aad = std::move(m_recv_buffer);
            m_recv_aad.resize(m_recv_aad.size() - BIP324Cipher::GARBAGE_TERMINATOR_LEN);
            m_recv_buffer.clear();
            SetReceiveState(RecvState::VERSION);
        } else if (m_recv_buffer.size() == MAX_GARBAGE_LEN + BIP324Cipher::GARBAGE_TERMINATOR_LEN) {
            // We've reached the maximum length for garbage + garbage terminator, and the
            // terminator still does not match. Abort.
            LogDebug(BCLog::NET, "V2 transport error: missing garbage terminator, peer=%d\n", m_nodeid);
            return false;
        } else {
            // We still need to receive more garbage and/or garbage terminator bytes.
        }
    } else {
        // We have less than GARBAGE_TERMINATOR_LEN (16) bytes, so we certainly need to receive
        // more first.
    }
    return true;
}